

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
ParseMessageSetWithDuplicateTags<proto2_unittest::TestAllTypes>::TestBody
          (ParseMessageSetWithDuplicateTags<proto2_unittest::TestAllTypes> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *plVar4;
  Nonnull<const_char_*> failure_msg;
  long *plVar5;
  size_type *psVar6;
  int extension_number;
  int extension_number_00;
  int extraout_EDX;
  long v2;
  Metadata MVar7;
  string end;
  string message;
  string id;
  string other_id;
  string other_message;
  string start;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  long *local_f0;
  long local_e0 [2];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  BuildMessageSetItemStart_abi_cxx11_();
  BuildMessageSetItemEnd_abi_cxx11_();
  MVar7 = proto2_unittest::TestMessageSetExtension1::GetMetadata
                    ((TestMessageSetExtension1 *)
                     proto2_unittest::_TestMessageSetExtension1_default_instance_);
  extension_number = (int)MVar7.reflection;
  v2 = (long)(MVar7.descriptor)->extension_count_;
  if (v2 < 1) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (0,v2,"index < extension_count()");
    extension_number = extraout_EDX;
  }
  else {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    BuildMessageSetItemTypeId_abi_cxx11_
              (&local_b0,(internal *)(ulong)(uint)(MVar7.descriptor)->extensions_->number_,
               extension_number);
    BuildMessageSetItemTypeId_abi_cxx11_(&local_90,(internal *)0x1e240,extension_number_00);
    WireFormatTest<proto2_unittest::TestAllTypes>::BuildMessageSetTestExtension1_abi_cxx11_
              (&local_d0,&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,0x7b);
    WireFormatTest<proto2_unittest::TestAllTypes>::BuildMessageSetTestExtension1_abi_cxx11_
              (&local_70,&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,0x141);
    paVar1 = &local_130.field_2;
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"id + other_id + message","");
    std::operator+(&local_110,&local_50,&local_b0);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)local_90._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_180 = *plVar5;
      lStack_178 = plVar4[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *plVar5;
      local_190 = (long *)*plVar4;
    }
    local_188 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_190,(ulong)local_d0._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_160 = *plVar5;
      lStack_158 = plVar4[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar5;
      local_170 = (long *)*plVar4;
    }
    local_168 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_f0);
    paVar2 = &local_150.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_150.field_2._M_allocated_capacity = *psVar6;
      local_150.field_2._8_8_ = plVar4[3];
      local_150._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar6;
      local_150._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_150._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
              (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_130,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    paVar3 = &local_110.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"id + message + other_id","");
    std::operator+(&local_110,&local_50,&local_b0);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)local_d0._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_180 = *plVar5;
      lStack_178 = plVar4[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *plVar5;
      local_190 = (long *)*plVar4;
    }
    local_188 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_190,(ulong)local_90._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_160 = *plVar5;
      lStack_158 = plVar4[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar5;
      local_170 = (long *)*plVar4;
    }
    local_168 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_f0);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_150.field_2._M_allocated_capacity = *psVar6;
      local_150.field_2._8_8_ = plVar4[3];
      local_150._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar6;
      local_150._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_150._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
              (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_130,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"message + id + other_id","");
    std::operator+(&local_110,&local_50,&local_d0);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)local_b0._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_180 = *plVar5;
      lStack_178 = plVar4[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *plVar5;
      local_190 = (long *)*plVar4;
    }
    local_188 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_190,(ulong)local_90._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_160 = *plVar5;
      lStack_158 = plVar4[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar5;
      local_170 = (long *)*plVar4;
    }
    local_168 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_f0);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_150.field_2._M_allocated_capacity = *psVar6;
      local_150.field_2._8_8_ = plVar4[3];
      local_150._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar6;
      local_150._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_150._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
              (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_130,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"id + message + other_message","");
    std::operator+(&local_110,&local_50,&local_b0);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)local_d0._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_180 = *plVar5;
      lStack_178 = plVar4[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *plVar5;
      local_190 = (long *)*plVar4;
    }
    local_188 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_190,(ulong)local_70._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_160 = *plVar5;
      lStack_158 = plVar4[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar5;
      local_170 = (long *)*plVar4;
    }
    local_168 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_f0);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_150.field_2._M_allocated_capacity = *psVar6;
      local_150.field_2._8_8_ = plVar4[3];
      local_150._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar6;
      local_150._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_150._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
              (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_130,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"message + id + other_message","");
    std::operator+(&local_110,&local_50,&local_d0);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)local_b0._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_180 = *plVar5;
      lStack_178 = plVar4[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *plVar5;
      local_190 = (long *)*plVar4;
    }
    local_188 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_190,(ulong)local_70._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_160 = *plVar5;
      lStack_158 = plVar4[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar5;
      local_170 = (long *)*plVar4;
    }
    local_168 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_f0);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_150.field_2._M_allocated_capacity = *psVar6;
      local_150.field_2._8_8_ = plVar4[3];
      local_150._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar6;
      local_150._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_150._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
              (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_130,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"message + other_message + id","");
    std::operator+(&local_110,&local_50,&local_d0);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)local_70._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_180 = *plVar5;
      lStack_178 = plVar4[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *plVar5;
      local_190 = (long *)*plVar4;
    }
    local_188 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_190,(ulong)local_b0._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_160 = *plVar5;
      lStack_158 = plVar4[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar5;
      local_170 = (long *)*plVar4;
    }
    local_168 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_f0);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_150.field_2._M_allocated_capacity = *psVar6;
      local_150.field_2._8_8_ = plVar4[3];
      local_150._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar6;
      local_150._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_150._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
              (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_130,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != local_e0) {
      operator_delete(local_f0,local_e0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xa95,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_90);
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseMessageSetWithDuplicateTags) {
  std::string start = BuildMessageSetItemStart();
  std::string end = BuildMessageSetItemEnd();
  std::string id = BuildMessageSetItemTypeId(
      TestFixture::TestMessageSetExtension1::descriptor()
          ->extension(0)
          ->number());
  std::string other_id = BuildMessageSetItemTypeId(123456);
  std::string message = this->BuildMessageSetTestExtension1();
  std::string other_message = this->BuildMessageSetTestExtension1(321);

  // Double id
  this->ValidateTestMessageSet("id + other_id + message",
                               start + id + other_id + message + end);
  this->ValidateTestMessageSet("id + message + other_id",
                               start + id + message + other_id + end);
  this->ValidateTestMessageSet("message + id + other_id",
                               start + message + id + other_id + end);
  // Double message
  this->ValidateTestMessageSet("id + message + other_message",
                               start + id + message + other_message + end);
  this->ValidateTestMessageSet("message + id + other_message",
                               start + message + id + other_message + end);
  this->ValidateTestMessageSet("message + other_message + id",
                               start + message + other_message + id + end);
}